

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

void test_read_num<short,int,int(*)(char_const**,short*)>
               (int num1,_func_int_char_ptr_ptr_short_ptr *read_f,bool is_ok)

{
  byte *pbVar1;
  byte bVar2;
  mp_type mVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined1 *puVar9;
  char (*pacVar10) [16];
  undefined1 *puVar11;
  long lVar12;
  float fVar13;
  char (*pacVar14) [16];
  code *pcVar15;
  double dVar16;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  char *pcVar17;
  char *pcVar18;
  ulong uVar19;
  uint uVar20;
  byte *pbVar21;
  ulong uVar22;
  undefined8 *puVar23;
  byte *pbVar24;
  undefined1 *puVar25;
  byte *pbVar26;
  ulong uVar27;
  undefined4 uVar28;
  byte *pbVar29;
  char *pcVar30;
  uint uVar31;
  uint *puVar32;
  char *pcVar33;
  undefined8 *puVar34;
  short sVar35;
  ulong uVar36;
  char *pcVar37;
  char *pcVar38;
  byte *pbVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  char mp_nums [16] [16];
  char str [256];
  double dStack_17a0;
  undefined1 *puStack_1798;
  char acStack_1790 [256];
  undefined1 uStack_1690;
  undefined8 uStack_168f;
  undefined1 auStack_1687 [247];
  undefined8 *puStack_1590;
  byte *pbStack_1588;
  code *pcStack_1580;
  double dStack_1570;
  undefined8 *puStack_1568;
  char (*pacStack_1560) [16];
  char acStack_1558 [256];
  byte bStack_1458;
  undefined1 auStack_1457 [2];
  undefined1 auStack_1455 [6];
  undefined8 uStack_144f;
  undefined8 uStack_1447;
  long lStack_1350;
  ulong uStack_1348;
  char *pcStack_1340;
  char *pcStack_1338;
  char *pcStack_1330;
  code *pcStack_1328;
  char (*pacStack_1320) [16];
  char *pcStack_1318;
  float fStack_1310;
  undefined4 uStack_130c;
  double dStack_1308;
  double dStack_1300;
  char (*pacStack_12f8) [16];
  char acStack_12f0 [256];
  byte bStack_11f0;
  undefined8 uStack_11ef;
  char acStack_11e7 [255];
  long lStack_10e8;
  ulong uStack_10e0;
  char *pcStack_10d8;
  char *pcStack_10d0;
  char *pcStack_10c8;
  code *pcStack_10c0;
  char (*pacStack_10b8) [16];
  char *pcStack_10b0;
  float fStack_10a8;
  undefined4 uStack_10a4;
  double dStack_10a0;
  double dStack_1098;
  code *pcStack_1090;
  byte bStack_1088;
  undefined8 uStack_1087;
  char acStack_107f [247];
  char acStack_f88 [256];
  undefined1 auStack_e88 [8];
  undefined8 *puStack_e80;
  ulong uStack_e78;
  undefined8 *puStack_e70;
  long lStack_e68;
  undefined1 *puStack_e60;
  code *pcStack_e58;
  code *pcStack_e50;
  float fStack_e44;
  double dStack_e40;
  double dStack_e38;
  undefined8 *puStack_e30;
  char (*pacStack_e28) [16];
  byte bStack_e20;
  undefined1 auStack_e1f [2];
  undefined1 auStack_e1d [6];
  undefined8 auStack_e17 [30];
  char acStack_d20 [256];
  undefined1 auStack_c20 [8];
  char (*pacStack_c18) [16];
  char *pcStack_c10;
  char *pcStack_c08;
  char *pcStack_c00;
  char *pcStack_bf8;
  code *pcStack_bf0;
  float fStack_be0;
  undefined4 uStack_bdc;
  char *pcStack_bd8;
  char *pcStack_bd0;
  double dStack_bc8;
  double dStack_bc0;
  char acStack_bb8 [9];
  char acStack_baf [247];
  char acStack_ab8 [256];
  undefined1 auStack_9b8 [8];
  ulong uStack_9b0;
  ulong uStack_9a8;
  char *pcStack_9a0;
  char (*pacStack_998) [16];
  undefined1 *puStack_990;
  code *pcStack_988;
  uint uStack_974;
  ulong uStack_970;
  float fStack_964;
  double dStack_960;
  undefined1 *puStack_958;
  byte bStack_950;
  undefined8 uStack_94f;
  undefined1 auStack_947 [247];
  char acStack_850 [256];
  undefined1 auStack_750 [8];
  byte *pbStack_748;
  char *pcStack_740;
  byte *pbStack_738;
  char (*pacStack_730) [16];
  byte *pbStack_728;
  code *pcStack_720;
  float fStack_718;
  int iStack_714;
  byte *pbStack_710;
  char (*pacStack_708) [16];
  double dStack_700;
  byte bStack_6f8;
  undefined8 uStack_6f7;
  byte abStack_6ef [247];
  char acStack_5f8 [256];
  undefined1 auStack_4f8 [8];
  undefined1 *puStack_4f0;
  char *pcStack_4e8;
  undefined1 *puStack_4e0;
  char *pcStack_4d8;
  long lStack_4d0;
  code *pcStack_4c8;
  uint uStack_4c0;
  float fStack_4bc;
  char *pcStack_4b8;
  ulong uStack_4b0;
  double dStack_4a8;
  byte bStack_4a0;
  undefined8 uStack_49f;
  undefined1 auStack_497 [247];
  char acStack_3a0 [256];
  undefined1 auStack_2a0 [8];
  byte *pbStack_298;
  byte *pbStack_290;
  ulong uStack_288;
  byte *pbStack_280;
  byte *pbStack_278;
  code *pcStack_270;
  uint local_25c;
  float local_258;
  undefined4 local_254;
  ulong local_250;
  byte *local_248;
  double local_240;
  byte local_238;
  undefined8 local_237;
  byte local_22f [247];
  char local_138 [256];
  byte local_38 [8];
  
  local_254 = SUB84(read_f,0);
  builtin_strncpy(local_138,"typed read of ",0xf);
  uVar36 = (ulong)num1;
  if (num1 < 0) {
    pcVar17 = "%lld";
    uVar27 = uVar36;
  }
  else {
    pcVar17 = "%llu";
    uVar27 = (ulong)(uint)num1;
  }
  pcStack_270 = (code *)0x12f4a8;
  local_25c = num1;
  iVar4 = snprintf(local_138 + 0xe,0xf2,pcVar17,uVar27);
  pcVar38 = local_138 + 0xe + iVar4;
  iVar5 = 0;
  pcStack_270 = (code *)0x12f4c7;
  iVar4 = snprintf(pcVar38,(long)local_38 - (long)pcVar38," into ");
  pcVar17 = (char *)(local_38 + -(long)(pcVar38 + iVar4));
  pcStack_270 = (code *)0x12f4e6;
  snprintf(pcVar38 + iVar4,(size_t)pcVar17,"int%zu_t",0x10);
  pcStack_270 = (code *)0x12f4f5;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x12f50e;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x12f51e;
  fputs(local_138,_stdout);
  pcStack_270 = (code *)0x12f52b;
  fputc(10,_stdout);
  if (-1 < (int)local_25c) {
    pcStack_270 = (code *)0x12f53f;
    iVar5 = test_encode_uint_all_sizes((char (*) [16])&local_238,(ulong)(uint)num1);
  }
  pacVar14 = (char (*) [16])(&local_238 + (long)iVar5 * 0x10);
  pcStack_270 = (code *)0x12f561;
  local_250 = uVar36;
  iVar4 = test_encode_int_all_sizes(pacVar14,uVar36);
  uVar20 = iVar5 + iVar4;
  if (uVar20 != 0 && SCARRY4(iVar5,iVar4) == (int)uVar20 < 0) {
    local_258 = (float)(int)local_25c;
    local_240 = (double)(int)local_25c;
    pbVar39 = (byte *)(ulong)uVar20;
    pbVar26 = (byte *)((long)&local_237 + 1);
    pbVar21 = (byte *)0x0;
    do {
      uVar20 = (uint)pacVar14;
      lVar7 = (long)pbVar21 * 0x10;
      pbVar24 = &local_238 + lVar7;
      bVar2 = pbVar26[-2];
      uVar36 = (ulong)bVar2;
      uVar27 = (ulong)(uint)(int)(char)bVar2;
      mVar3 = mp_type_hint[uVar36];
      pbVar29 = pbVar26;
      if (mVar3 == MP_UINT) {
        uVar31 = 0x139a3c;
        switch(bVar2) {
        case 0xcc:
          uVar36 = (ulong)pbVar26[-1];
          uVar20 = uVar31;
          break;
        case 0xcd:
          uVar36 = (ulong)(ushort)(*(ushort *)(pbVar26 + -1) << 8 | *(ushort *)(pbVar26 + -1) >> 8);
          pbVar29 = local_22f + lVar7 + -6;
          uVar20 = uVar31;
          break;
        case 0xce:
          uVar20 = *(uint *)(pbVar26 + -1);
          uVar36 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                          uVar20 << 0x18);
          pbVar29 = local_22f + lVar7 + -4;
          uVar20 = uVar31;
          break;
        case 0xcf:
          uVar36 = *(ulong *)(pbVar26 + -1);
          uVar36 = uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
                   (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
                   (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 |
                   (uVar36 & 0xff00) << 0x28 | uVar36 << 0x38;
          pbVar29 = local_22f + lVar7;
          uVar20 = uVar31;
          break;
        default:
          if (-1 < (char)bVar2) {
            pbVar29 = local_22f + lVar7 + -8;
            break;
          }
LAB_0012f938:
          pcStack_270 = (code *)0x12f93d;
          test_read_num<short,int,int(*)(char_const**,short*)>();
          goto LAB_0012f93d;
        }
        if (uVar36 == local_250) goto LAB_0012f717;
LAB_0012f98f:
        pcStack_270 = (code *)0x12f994;
        test_read_num<short,int,int(*)(char_const**,short*)>();
        pbVar29 = pbVar39;
        goto LAB_0012f994;
      }
      if (mVar3 != MP_FLOAT) {
        if (mVar3 != MP_INT) {
          if (bVar2 != 0xcb) goto LAB_0012f942;
          uVar36 = *(ulong *)(pbVar26 + -1);
          dVar16 = (double)(uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
                            (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
                            (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 |
                            (uVar36 & 0xff00) << 0x28 | uVar36 << 0x38);
          if ((dVar16 != local_240) || (NAN(dVar16) || NAN(local_240))) {
            pcStack_270 = (code *)0x12f966;
            test_read_num<short,int,int(*)(char_const**,short*)>();
            goto LAB_0012f966;
          }
          pbVar29 = local_22f + lVar7;
          goto LAB_0012f717;
        }
        uVar36 = (ulong)(char)bVar2;
        uVar31 = 0x139a4c;
        switch(bVar2) {
        case 0xd0:
          uVar36 = (ulong)(char)pbVar26[-1];
          uVar20 = uVar31;
          break;
        case 0xd1:
          uVar36 = (ulong)(short)(*(ushort *)(pbVar26 + -1) << 8 | *(ushort *)(pbVar26 + -1) >> 8);
          pbVar29 = local_22f + lVar7 + -6;
          uVar20 = uVar31;
          break;
        case 0xd2:
          uVar20 = *(uint *)(pbVar26 + -1);
          uVar36 = (ulong)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                               uVar20 << 0x18);
          pbVar29 = local_22f + lVar7 + -4;
          uVar20 = uVar31;
          break;
        case 0xd3:
          uVar36 = *(ulong *)(pbVar26 + -1);
          uVar36 = uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
                   (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
                   (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 |
                   (uVar36 & 0xff00) << 0x28 | uVar36 << 0x38;
          pbVar29 = local_22f + lVar7;
          uVar20 = uVar31;
          break;
        default:
          if (bVar2 < 0xe0) {
            pcStack_270 = (code *)0x12f938;
            test_read_num<short,int,int(*)(char_const**,short*)>();
            goto LAB_0012f938;
          }
          pbVar29 = local_22f + lVar7 + -8;
        }
        if (uVar36 == local_250) goto LAB_0012f717;
LAB_0012f98a:
        pcStack_270 = (code *)0x12f98f;
        test_read_num<short,int,int(*)(char_const**,short*)>();
        goto LAB_0012f98f;
      }
      if (bVar2 != 0xca) {
LAB_0012f966:
        pcStack_270 = (code *)0x12f985;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar31 = *(uint *)(pbVar26 + -1);
      fVar13 = (float)(uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                      uVar31 << 0x18);
      if ((fVar13 != local_258) || (NAN(fVar13) || NAN(local_258))) {
        pcStack_270 = (code *)0x12f98a;
        test_read_num<short,int,int(*)(char_const**,short*)>();
        goto LAB_0012f98a;
      }
      pbVar29 = pbVar26 + 3;
LAB_0012f717:
      pcVar17 = (char *)(pbVar26 + -2);
      switch(bVar2) {
      case 0xcc:
        uVar27 = (ulong)pbVar26[-1];
        goto LAB_0012f74a;
      case 0xcd:
        pbVar24 = pbVar26 + 1;
        uVar27 = (ulong)(ushort)(*(ushort *)(pbVar26 + -1) << 8 | *(ushort *)(pbVar26 + -1) >> 8);
        break;
      case 0xce:
        uVar20 = *(uint *)(pbVar26 + -1);
        uVar27 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                        uVar20 << 0x18);
        pbVar24 = local_22f + lVar7 + -4;
        break;
      case 0xcf:
        uVar36 = *(ulong *)(pbVar26 + -1);
        uVar27 = uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
                 (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
                 (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 |
                 (uVar36 & 0xff00) << 0x28 | uVar36 << 0x38;
        pbVar24 = local_22f + lVar7;
        break;
      case 0xd0:
        uVar27 = (ulong)(uint)(int)(char)pbVar26[-1];
LAB_0012f74a:
        pbVar24 = local_22f + lVar7 + -7;
        goto LAB_0012f7cc;
      case 0xd1:
        uVar27 = (ulong)(ushort)(*(ushort *)(pbVar26 + -1) << 8 | *(ushort *)(pbVar26 + -1) >> 8);
        pbVar24 = local_22f + lVar7 + -6;
        goto LAB_0012f7cc;
      case 0xd2:
        uVar20 = *(uint *)(pbVar26 + -1);
        pbVar24 = pbVar26 + 3;
        uVar27 = (ulong)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                             uVar20 << 0x18);
        goto LAB_0012f7b3;
      case 0xd3:
        uVar36 = *(ulong *)(pbVar26 + -1);
        uVar27 = uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
                 (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
                 (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 |
                 (uVar36 & 0xff00) << 0x28 | uVar36 << 0x38;
        pbVar24 = local_22f + lVar7;
LAB_0012f7b3:
        if ((long)(short)uVar27 != uVar27) goto LAB_0012f90f;
        goto LAB_0012f7cc;
      default:
        if (-0x21 < (char)bVar2) {
          pbVar24 = local_22f + lVar7 + -8;
          goto LAB_0012f7cc;
        }
        goto LAB_0012f90f;
      }
      if (uVar27 < 0x8000) {
LAB_0012f7cc:
        iVar4 = 1;
        iVar5 = 0;
      }
      else {
LAB_0012f90f:
        uVar27 = 0;
        iVar5 = 1;
        iVar4 = 0;
        pbVar24 = (byte *)pcVar17;
      }
      if ((char)local_254 == '\0') {
        pcStack_270 = (code *)0x12f894;
        _ok(iVar5,"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
        pacVar14 = (char (*) [16])(ulong)((byte *)pcVar17 == pbVar24);
        pcStack_270 = (code *)0x12f8ba;
        _ok((uint)((byte *)pcVar17 == pbVar24),"mp_num_pos2 == mp_nums[i]",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x738,"check position");
      }
      else {
        pcVar17 = 
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
        pcStack_270 = (code *)0x12f813;
        local_248 = pbVar21;
        _ok(iVar4,"rc == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
        uVar20 = (uint)(pbVar29 == pbVar24);
        pcStack_270 = (code *)0x12f839;
        _ok((uint)(pbVar29 == pbVar24),"mp_num_pos1 == mp_num_pos2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73c,"check position");
        sVar35 = (short)uVar27;
        if ((int)local_25c < 0) {
          pbVar21 = pbVar39;
          if (-1 < sVar35) {
LAB_0012f994:
            pcStack_270 = test_read_num<int,int,int(*)(char_const**,int*)>;
            test_read_num<short,int,int(*)(char_const**,short*)>();
            builtin_strncpy(acStack_3a0,"typed read of ",0xf);
            pcVar38 = (char *)(long)(int)uVar20;
            pcVar37 = (char *)(ulong)uVar20;
            if ((int)uVar20 < 0) {
              pcVar18 = "%lld";
              pcVar30 = pcVar38;
            }
            else {
              pcVar18 = "%llu";
              pcVar30 = pcVar37;
            }
            pcStack_4c8 = (code *)0x12fa16;
            uStack_4c0 = uVar20;
            pbStack_298 = pbVar21;
            pbStack_290 = (byte *)pcVar17;
            uStack_288 = uVar27;
            pbStack_280 = pbVar26;
            pbStack_278 = pbVar29;
            pcStack_270 = (code *)pbVar24;
            iVar4 = snprintf(acStack_3a0 + 0xe,0xf2,pcVar18,pcVar30);
            pcVar17 = acStack_3a0 + 0xe + iVar4;
            iVar5 = 0;
            pcStack_4c8 = (code *)0x12fa34;
            iVar4 = snprintf(pcVar17,(size_t)(auStack_2a0 + -(long)pcVar17)," into ");
            pcStack_4c8 = (code *)0x12fa53;
            snprintf(pcVar17 + iVar4,(size_t)(auStack_2a0 + -(long)(pcVar17 + iVar4)),"int%zu_t",
                     0x20);
            pcStack_4c8 = (code *)0x12fa62;
            _space((FILE *)_stdout);
            pcStack_4c8 = (code *)0x12fa7b;
            fwrite("# ",2,1,_stdout);
            pcStack_4c8 = (code *)0x12fa8b;
            fputs(acStack_3a0,_stdout);
            pcStack_4c8 = (code *)0x12fa98;
            fputc(10,_stdout);
            if (-1 < (int)uStack_4c0) {
              pcStack_4c8 = (code *)0x12faab;
              iVar5 = test_encode_uint_all_sizes((char (*) [16])&bStack_4a0,(uint64_t)pcVar37);
            }
            pacVar14 = (char (*) [16])(&bStack_4a0 + (long)iVar5 * 0x10);
            pcStack_4c8 = (code *)0x12facc;
            pcStack_4b8 = pcVar38;
            iVar4 = test_encode_int_all_sizes(pacVar14,(int64_t)pcVar38);
            uVar20 = iVar5 + iVar4;
            puVar9 = (undefined1 *)(ulong)uVar20;
            if (uVar20 == 0 || SCARRY4(iVar5,iVar4) != (int)uVar20 < 0) {
              return;
            }
            fStack_4bc = (float)(int)uStack_4c0;
            dStack_4a8 = (double)(int)uStack_4c0;
            uVar36 = (ulong)uVar20;
            puVar25 = (undefined1 *)((long)&uStack_49f + 1);
            lVar7 = 0;
            goto LAB_0012faf9;
          }
          uVar20 = (uint)sVar35;
          pcVar38 = "(int64_t)num1 == (int64_t)num2";
          iVar4 = 0x746;
        }
        else {
          if (sVar35 < 0) {
LAB_0012f93d:
            pcStack_270 = (code *)0x12f942;
            test_read_num<short,int,int(*)(char_const**,short*)>();
LAB_0012f942:
            pcStack_270 = (code *)0x12f961;
            __assert_fail("c == 0xcb",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x987,"double mp_decode_double(const char **)");
          }
          uVar20 = (uint)uVar27 & 0xffff;
          pcVar38 = "(uint64_t)num1 == (uint64_t)num2";
          iVar4 = 0x743;
        }
        pacVar14 = (char (*) [16])(ulong)(uVar20 == local_25c);
        pcStack_270 = (code *)0x12f8f8;
        _ok((uint)(uVar20 == local_25c),pcVar38,
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            iVar4,"check int number");
        pbVar21 = local_248;
      }
      pbVar21 = pbVar21 + 1;
      pbVar26 = pbVar26 + 0x10;
      pbVar39 = pbVar39 + -1;
    } while (pbVar39 != (byte *)0x0);
  }
  return;
LAB_0012faf9:
  lVar8 = lVar7 * 0x10;
  bVar2 = puVar25[-2];
  pcVar38 = (char *)(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pcVar38];
  puVar11 = puVar25;
  if (mVar3 != MP_UINT) {
    if (mVar3 == MP_FLOAT) {
      if (bVar2 != 0xca) goto LAB_0012fe3c;
      uVar20 = *(uint *)(puVar25 + -1);
      fVar13 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                      uVar20 << 0x18);
      if ((fVar13 != fStack_4bc) || (NAN(fVar13) || NAN(fStack_4bc))) {
        pcStack_4c8 = (code *)0x12fe60;
        test_read_num<int,int,int(*)(char_const**,int*)>();
        goto LAB_0012fe60;
      }
      puVar11 = puVar25 + 3;
      goto LAB_0012fc78;
    }
    if (mVar3 == MP_INT) {
      pcVar38 = (char *)(long)(char)bVar2;
      iVar4 = bVar2 - 0xd0;
      puVar32 = &switchD_0012fb52::switchdataD_00139a8c;
      switch(iVar4) {
      case 0:
        pcVar38 = (char *)(long)(char)puVar25[-1];
        break;
      case 1:
        pcVar38 = (char *)(long)(short)(*(ushort *)(puVar25 + -1) << 8 |
                                       *(ushort *)(puVar25 + -1) >> 8);
        puVar11 = auStack_497 + lVar8 + -6;
        break;
      case 2:
        uVar20 = *(uint *)(puVar25 + -1);
        pcVar38 = (char *)(long)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                      (uVar20 & 0xff00) << 8 | uVar20 << 0x18);
        puVar11 = auStack_497 + lVar8 + -4;
        break;
      case 3:
        uVar27 = *(ulong *)(puVar25 + -1);
        pcVar38 = (char *)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                           (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                           (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                           (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
        puVar11 = auStack_497 + lVar8;
        break;
      default:
        if (bVar2 < 0xe0) {
          pcStack_4c8 = (code *)0x12fe28;
          test_read_num<int,int,int(*)(char_const**,int*)>();
          goto LAB_0012fe28;
        }
        puVar32 = (uint *)pacVar14;
        puVar11 = auStack_497 + lVar8 + -8;
      }
      if (pcVar38 == pcStack_4b8) goto LAB_0012fc78;
      pcStack_4c8 = (code *)0x12fe84;
      test_read_num<int,int,int(*)(char_const**,int*)>();
      goto LAB_0012fe84;
    }
    if (bVar2 != 0xcb) {
LAB_0012fe60:
      pcStack_4c8 = (code *)0x12fe7f;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    uVar27 = *(ulong *)(puVar25 + -1);
    dVar16 = (double)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                      (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                      (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                      (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
    if ((dVar16 == dStack_4a8) && (!NAN(dVar16) && !NAN(dStack_4a8))) {
      puVar11 = auStack_497 + lVar8;
      goto LAB_0012fc78;
    }
    goto LAB_0012fe37;
  }
  iVar4 = bVar2 - 0xcc;
  puVar32 = &switchD_0012fbb0::switchdataD_00139a7c;
  switch(iVar4) {
  case 0:
    pcVar38 = (char *)(ulong)(byte)puVar25[-1];
    break;
  case 1:
    pcVar38 = (char *)(ulong)(ushort)(*(ushort *)(puVar25 + -1) << 8 |
                                     *(ushort *)(puVar25 + -1) >> 8);
    puVar11 = auStack_497 + lVar8 + -6;
    break;
  case 2:
    uVar20 = *(uint *)(puVar25 + -1);
    pcVar38 = (char *)(ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                             uVar20 << 0x18);
    puVar11 = auStack_497 + lVar8 + -4;
    break;
  case 3:
    uVar27 = *(ulong *)(puVar25 + -1);
    pcVar38 = (char *)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                       (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                       (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                       (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
    puVar11 = auStack_497 + lVar8;
    break;
  default:
    if (-1 < (char)bVar2) {
      puVar32 = (uint *)pacVar14;
      puVar11 = auStack_497 + lVar8 + -8;
      break;
    }
LAB_0012fe28:
    pcStack_4c8 = (code *)0x12fe2d;
    test_read_num<int,int,int(*)(char_const**,int*)>();
    goto LAB_0012fe2d;
  }
  if (pcVar38 != pcStack_4b8) {
LAB_0012fe84:
    pcStack_4c8 = test_read_num<int,long,int(*)(char_const**,int*)>;
    test_read_num<int,int,int(*)(char_const**,int*)>();
    builtin_strncpy(acStack_5f8,"typed read of ",0xf);
    pcVar38 = "%lld";
    if (-1 < (long)puVar32) {
      pcVar38 = "%llu";
    }
    iVar5 = 0;
    pcStack_720 = (code *)0x12fef9;
    iStack_714 = iVar4;
    puStack_4f0 = puVar9;
    pcStack_4e8 = pcVar17;
    puStack_4e0 = puVar11;
    pcStack_4d8 = pcVar37;
    lStack_4d0 = lVar7;
    pcStack_4c8 = (code *)puVar25;
    iVar4 = snprintf(acStack_5f8 + 0xe,0xf2,pcVar38,puVar32);
    pcVar17 = acStack_5f8 + (long)iVar4 + 0xe;
    pcStack_720 = (code *)0x12ff1d;
    iVar4 = snprintf(pcVar17,(size_t)(auStack_4f8 + -(long)pcVar17)," into ");
    pcStack_720 = (code *)0x12ff3c;
    snprintf(pcVar17 + iVar4,(size_t)(auStack_4f8 + -(long)(pcVar17 + iVar4)),"int%zu_t",0x20);
    pcStack_720 = (code *)0x12ff4b;
    _space((FILE *)_stdout);
    pcStack_720 = (code *)0x12ff64;
    fwrite("# ",2,1,_stdout);
    pcStack_720 = (code *)0x12ff74;
    fputs(acStack_5f8,_stdout);
    pcStack_720 = (code *)0x12ff81;
    fputc(10,_stdout);
    if (-1 < (long)puVar32) {
      pcStack_720 = (code *)0x12ff93;
      iVar5 = test_encode_uint_all_sizes((char (*) [16])&bStack_6f8,(uint64_t)puVar32);
    }
    pacVar14 = (char (*) [16])(&bStack_6f8 + (long)iVar5 * 0x10);
    pcStack_720 = (code *)0x12ffaf;
    iVar4 = test_encode_int_all_sizes(pacVar14,(int64_t)puVar32);
    uVar20 = iVar5 + iVar4;
    if (uVar20 == 0 || SCARRY4(iVar5,iVar4) != (int)uVar20 < 0) {
      return;
    }
    fStack_718 = (float)(long)puVar32;
    dStack_700 = (double)(long)puVar32;
    pbVar39 = (byte *)(ulong)uVar20;
    pbVar26 = (byte *)((long)&uStack_6f7 + 1);
    pbVar21 = (byte *)0x0;
    pacStack_708 = (char (*) [16])puVar32;
    goto LAB_0012ffde;
  }
LAB_0012fc78:
  uStack_4b0 = uVar36;
  switch(bVar2) {
  case 0xcc:
    pcVar17 = (char *)(ulong)(byte)puVar25[-1];
    goto LAB_0012fcb0;
  case 0xcd:
    puVar9 = auStack_497 + lVar8 + -6;
    pcVar17 = (char *)(ulong)(ushort)(*(ushort *)(puVar25 + -1) << 8 |
                                     *(ushort *)(puVar25 + -1) >> 8);
    break;
  case 0xce:
    uVar20 = *(uint *)(puVar25 + -1);
    pcVar17 = (char *)(ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                             uVar20 << 0x18);
    puVar9 = puVar25 + 3;
    goto LAB_0012fcce;
  case 0xcf:
    uVar36 = *(ulong *)(puVar25 + -1);
    pcVar17 = (char *)(uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
                       (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
                       (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 |
                       (uVar36 & 0xff00) << 0x28 | uVar36 << 0x38);
    puVar9 = auStack_497 + lVar8;
LAB_0012fcce:
    if (pcVar17 < (char *)0x80000000) break;
LAB_0012fe07:
    pcVar17 = (char *)0x0;
    iVar4 = 0;
    puVar9 = puVar25 + -2;
    goto LAB_0012fd2c;
  case 0xd0:
    pcVar17 = (char *)(ulong)(uint)(int)(char)puVar25[-1];
LAB_0012fcb0:
    puVar9 = auStack_497 + lVar8 + -7;
    break;
  case 0xd1:
    puVar9 = auStack_497 + lVar8 + -6;
    pcVar17 = (char *)(ulong)(uint)(int)(short)(*(ushort *)(puVar25 + -1) << 8 |
                                               *(ushort *)(puVar25 + -1) >> 8);
    break;
  case 0xd2:
    uVar20 = *(uint *)(puVar25 + -1);
    pcVar17 = (char *)(ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                             uVar20 << 0x18);
    puVar9 = auStack_497 + lVar8 + -4;
    break;
  case 0xd3:
    uVar36 = *(ulong *)(puVar25 + -1);
    uVar27 = uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
             (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8;
    pcVar17 = (char *)(uVar27 | (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 |
                       (uVar36 & 0xff00) << 0x28 | uVar36 << 0x38);
    if ((char *)(long)(int)uVar27 == pcVar17) {
      puVar9 = auStack_497 + lVar8;
      break;
    }
    goto LAB_0012fe07;
  default:
    if ((char)bVar2 < -0x20) goto LAB_0012fe07;
    iVar4 = 1;
    pcVar17 = (char *)(ulong)(uint)(int)(char)bVar2;
    puVar9 = auStack_497 + lVar8 + -8;
    goto LAB_0012fd2c;
  }
  iVar4 = 1;
LAB_0012fd2c:
  pcVar37 = "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  pcStack_4c8 = (code *)0x12fd50;
  _ok(iVar4,"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X");
  pcStack_4c8 = (code *)0x12fd76;
  _ok((uint)(puVar11 == puVar9),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  uVar20 = (uint)pcVar17;
  if ((int)uStack_4c0 < 0) {
    if (-1 < (int)uVar20) goto LAB_0012fe32;
    pcVar38 = "(int64_t)num1 == (int64_t)num2";
    iVar4 = 0x746;
  }
  else {
    if ((int)uVar20 < 0) {
LAB_0012fe2d:
      pcStack_4c8 = (code *)0x12fe32;
      test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_0012fe32:
      pcStack_4c8 = (code *)0x12fe37;
      test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_0012fe37:
      pcStack_4c8 = (code *)0x12fe3c;
      test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_0012fe3c:
      pcStack_4c8 = (code *)0x12fe5b;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    pcVar38 = "(uint64_t)num1 == (uint64_t)num2";
    iVar4 = 0x743;
  }
  pacVar14 = (char (*) [16])(ulong)(uVar20 == uStack_4c0);
  pcStack_4c8 = (code *)0x12fdd8;
  _ok((uint)(uVar20 == uStack_4c0),pcVar38,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar4,
      "check int number");
  lVar7 = lVar7 + 1;
  puVar25 = puVar25 + 0x10;
  uVar36 = uStack_4b0 - 1;
  if (uVar36 == 0) {
    return;
  }
  goto LAB_0012faf9;
LAB_0012ffde:
  uVar20 = (uint)pacVar14;
  lVar7 = (long)pbVar21 * 0x10;
  pbVar24 = &bStack_6f8 + lVar7;
  bVar2 = pbVar26[-2];
  pacVar14 = (char (*) [16])(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pacVar14];
  pbVar29 = pbVar26;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pacVar14 = (char (*) [16])(ulong)pbVar26[-1];
      break;
    case 0xcd:
      pacVar14 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pbVar26 + -1) << 8 | *(ushort *)(pbVar26 + -1) >> 8);
      pbVar29 = abStack_6ef + lVar7 + -6;
      break;
    case 0xce:
      uVar31 = *(uint *)(pbVar26 + -1);
      pacVar14 = (char (*) [16])
                 (ulong)(uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                        uVar31 << 0x18);
      pbVar29 = abStack_6ef + lVar7 + -4;
      break;
    case 0xcf:
      uVar36 = *(ulong *)(pbVar26 + -1);
      pacVar14 = (char (*) [16])
                 (uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
                  (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
                  (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 |
                  (uVar36 & 0xff00) << 0x28 | uVar36 << 0x38);
      pbVar29 = abStack_6ef + lVar7;
      break;
    default:
      if (-1 < (char)bVar2) {
        pbVar29 = abStack_6ef + lVar7 + -8;
        break;
      }
LAB_00130380:
      pcStack_720 = (code *)0x130385;
      test_read_num<int,long,int(*)(char_const**,int*)>();
      goto LAB_00130385;
    }
    if (pacVar14 == (char (*) [16])puVar32) goto LAB_00130159;
LAB_001303d7:
    pcStack_720 = (code *)0x1303dc;
    test_read_num<int,long,int(*)(char_const**,int*)>();
    pbVar29 = pbVar39;
    pcVar38 = (char *)puVar32;
    goto LAB_001303dc;
  }
  if (mVar3 != MP_FLOAT) {
    if (mVar3 != MP_INT) {
      if (bVar2 != 0xcb) goto LAB_0013038a;
      uVar36 = *(ulong *)(pbVar26 + -1);
      dVar16 = (double)(uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
                        (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
                        (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 |
                        (uVar36 & 0xff00) << 0x28 | uVar36 << 0x38);
      if ((dVar16 != dStack_700) || (NAN(dVar16) || NAN(dStack_700))) {
        pcStack_720 = (code *)0x1303ae;
        test_read_num<int,long,int(*)(char_const**,int*)>();
        goto LAB_001303ae;
      }
      pbVar29 = abStack_6ef + lVar7;
      goto LAB_00130159;
    }
    pacVar14 = (char (*) [16])(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pacVar14 = (char (*) [16])(long)(char)pbVar26[-1];
      break;
    case 0xd1:
      pacVar14 = (char (*) [16])
                 (long)(short)(*(ushort *)(pbVar26 + -1) << 8 | *(ushort *)(pbVar26 + -1) >> 8);
      pbVar29 = abStack_6ef + lVar7 + -6;
      break;
    case 0xd2:
      uVar31 = *(uint *)(pbVar26 + -1);
      pacVar14 = (char (*) [16])
                 (long)(int)(uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                            uVar31 << 0x18);
      pbVar29 = abStack_6ef + lVar7 + -4;
      break;
    case 0xd3:
      uVar36 = *(ulong *)(pbVar26 + -1);
      pacVar14 = (char (*) [16])
                 (uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
                  (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
                  (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 |
                  (uVar36 & 0xff00) << 0x28 | uVar36 << 0x38);
      pbVar29 = abStack_6ef + lVar7;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_720 = (code *)0x130380;
        test_read_num<int,long,int(*)(char_const**,int*)>();
        goto LAB_00130380;
      }
      pbVar29 = abStack_6ef + lVar7 + -8;
    }
    if (pacVar14 == (char (*) [16])puVar32) goto LAB_00130159;
LAB_001303d2:
    pcStack_720 = (code *)0x1303d7;
    test_read_num<int,long,int(*)(char_const**,int*)>();
    goto LAB_001303d7;
  }
  if (bVar2 != 0xca) {
LAB_001303ae:
    pcStack_720 = (code *)0x1303cd;
    __assert_fail("c == 0xca",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0x97e,"float mp_decode_float(const char **)");
  }
  uVar31 = *(uint *)(pbVar26 + -1);
  fVar13 = (float)(uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                  uVar31 << 0x18);
  if ((fVar13 != fStack_718) || (NAN(fVar13) || NAN(fStack_718))) {
    pcStack_720 = (code *)0x1303d2;
    test_read_num<int,long,int(*)(char_const**,int*)>();
    goto LAB_001303d2;
  }
  pbVar29 = pbVar26 + 3;
LAB_00130159:
  pbVar1 = pbVar26 + -2;
  switch(bVar2) {
  case 0xcc:
    pcVar17 = (char *)(ulong)pbVar26[-1];
    goto LAB_0013018c;
  case 0xcd:
    pbVar24 = abStack_6ef + lVar7 + -6;
    pcVar17 = (char *)(ulong)(ushort)(*(ushort *)(pbVar26 + -1) << 8 |
                                     *(ushort *)(pbVar26 + -1) >> 8);
    break;
  case 0xce:
    uVar20 = *(uint *)(pbVar26 + -1);
    pcVar17 = (char *)(ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                             uVar20 << 0x18);
    pbVar24 = pbVar26 + 3;
    goto LAB_001301aa;
  case 0xcf:
    uVar36 = *(ulong *)(pbVar26 + -1);
    pcVar17 = (char *)(uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
                       (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
                       (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 |
                       (uVar36 & 0xff00) << 0x28 | uVar36 << 0x38);
    pbVar24 = abStack_6ef + lVar7;
LAB_001301aa:
    if (pcVar17 < (char *)0x80000000) break;
LAB_00130357:
    iVar5 = 1;
    pcVar17 = (char *)0x0;
    iVar4 = 0;
    pbVar24 = pbVar1;
    goto LAB_00130207;
  case 0xd0:
    pcVar17 = (char *)(ulong)(uint)(int)(char)pbVar26[-1];
LAB_0013018c:
    pbVar24 = abStack_6ef + lVar7 + -7;
    break;
  case 0xd1:
    pbVar24 = abStack_6ef + lVar7 + -6;
    pcVar17 = (char *)(ulong)(uint)(int)(short)(*(ushort *)(pbVar26 + -1) << 8 |
                                               *(ushort *)(pbVar26 + -1) >> 8);
    break;
  case 0xd2:
    uVar20 = *(uint *)(pbVar26 + -1);
    pcVar17 = (char *)(ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                             uVar20 << 0x18);
    pbVar24 = abStack_6ef + lVar7 + -4;
    break;
  case 0xd3:
    uVar36 = *(ulong *)(pbVar26 + -1);
    uVar27 = uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
             (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8;
    pcVar17 = (char *)(uVar27 | (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 |
                       (uVar36 & 0xff00) << 0x28 | uVar36 << 0x38);
    if ((char *)(long)(int)uVar27 == pcVar17) {
      pbVar24 = abStack_6ef + lVar7;
      break;
    }
    goto LAB_00130357;
  default:
    if ((char)bVar2 < -0x20) goto LAB_00130357;
    iVar4 = 1;
    iVar5 = 0;
    pcVar17 = (char *)(ulong)(uint)(int)(char)bVar2;
    pbVar24 = abStack_6ef + lVar7 + -8;
    goto LAB_00130207;
  }
  iVar4 = 1;
  iVar5 = 0;
LAB_00130207:
  if ((char)iStack_714 == '\0') {
    pcVar17 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_720 = (code *)0x1302c4;
    _ok(iVar5,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X");
    pacVar14 = (char (*) [16])(ulong)(pbVar1 == pbVar24);
    pcStack_720 = (code *)0x1302ea;
    _ok((uint)(pbVar1 == pbVar24),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
    puVar32 = (uint *)pacStack_708;
  }
  else {
    pcStack_720 = (code *)0x130243;
    pbStack_710 = pbVar21;
    _ok(iVar4,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X");
    uVar20 = (uint)(pbVar29 == pbVar24);
    pcStack_720 = (code *)0x130269;
    _ok((uint)(pbVar29 == pbVar24),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    puVar32 = (uint *)pacStack_708;
    iVar4 = (int)pcVar17;
    if ((long)pacStack_708 < 0) {
      pbVar21 = pbVar39;
      pcVar38 = *pacStack_708;
      if (-1 < iVar4) {
LAB_001303dc:
        pcStack_720 = test_read_num<long,int,int(*)(char_const**,long*)>;
        test_read_num<int,long,int(*)(char_const**,int*)>();
        builtin_strncpy(acStack_850,"typed read of ",0xf);
        uStack_970 = (ulong)(int)uVar20;
        if ((int)uVar20 < 0) {
          pcVar37 = "%lld";
          uVar36 = uStack_970;
        }
        else {
          pcVar37 = "%llu";
          uVar36 = (ulong)uVar20;
        }
        pcStack_988 = (code *)0x130463;
        uStack_974 = uVar20;
        pbStack_748 = pbVar21;
        pcStack_740 = pcVar17;
        pbStack_738 = pbVar29;
        pacStack_730 = (char (*) [16])pcVar38;
        pbStack_728 = pbVar24;
        pcStack_720 = (code *)pbVar26;
        iVar4 = snprintf(acStack_850 + 0xe,0xf2,pcVar37,uVar36);
        pcVar17 = acStack_850 + 0xe + iVar4;
        iVar5 = 0;
        pcStack_988 = (code *)0x130481;
        iVar4 = snprintf(pcVar17,(size_t)(auStack_750 + -(long)pcVar17)," into ");
        pcStack_988 = (code *)0x1304a0;
        snprintf(pcVar17 + iVar4,(size_t)(auStack_750 + -(long)(pcVar17 + iVar4)),"int%zu_t",0x40);
        pcStack_988 = (code *)0x1304af;
        _space((FILE *)_stdout);
        pcStack_988 = (code *)0x1304c8;
        fwrite("# ",2,1,_stdout);
        pcStack_988 = (code *)0x1304d8;
        fputs(acStack_850,_stdout);
        pcStack_988 = (code *)0x1304e5;
        fputc(10,_stdout);
        if (-1 < (int)uStack_974) {
          pcStack_988 = (code *)0x1304f9;
          iVar5 = test_encode_uint_all_sizes((char (*) [16])&bStack_950,(ulong)uVar20);
        }
        uVar36 = uStack_970;
        pcVar17 = (char *)(&bStack_950 + (long)iVar5 * 0x10);
        pcStack_988 = (code *)0x13051a;
        iVar4 = test_encode_int_all_sizes((char (*) [16])pcVar17,uStack_970);
        uVar20 = iVar5 + iVar4;
        if (uVar20 == 0 || SCARRY4(iVar5,iVar4) != (int)uVar20 < 0) {
          return;
        }
        fStack_964 = (float)(int)uStack_974;
        dStack_960 = (double)(int)uStack_974;
        uVar27 = (ulong)uVar20;
        puVar9 = (undefined1 *)((long)&uStack_94f + 1);
        pcVar37 = (char *)0x0;
        goto LAB_00130547;
      }
      pacVar10 = (char (*) [16])(long)iVar4;
      pcVar38 = "(int64_t)num1 == (int64_t)num2";
      iVar4 = 0x746;
    }
    else {
      if (iVar4 < 0) {
LAB_00130385:
        pcStack_720 = (code *)0x13038a;
        test_read_num<int,long,int(*)(char_const**,int*)>();
LAB_0013038a:
        pcStack_720 = (code *)0x1303a9;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pacVar10 = (char (*) [16])((ulong)pcVar17 & 0xffffffff);
      pcVar38 = "(uint64_t)num1 == (uint64_t)num2";
      iVar4 = 0x743;
    }
    pacVar14 = (char (*) [16])(ulong)(pacVar10 == pacStack_708);
    pcStack_720 = (code *)0x13032a;
    _ok((uint)(pacVar10 == pacStack_708),pcVar38,
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        iVar4,"check int number");
    pbVar21 = pbStack_710;
  }
  pbVar21 = pbVar21 + 1;
  pbVar26 = pbVar26 + 0x10;
  pbVar39 = pbVar39 + -1;
  if (pbVar39 == (byte *)0x0) {
    return;
  }
  goto LAB_0012ffde;
LAB_00130547:
  lVar7 = (long)pcVar37 * 0x10;
  bVar2 = puVar9[-2];
  uVar19 = (ulong)bVar2;
  uVar22 = (ulong)(char)bVar2;
  mVar3 = mp_type_hint[uVar19];
  puVar25 = puVar9;
  if (mVar3 != MP_UINT) {
    if (mVar3 == MP_FLOAT) {
      if (bVar2 != 0xca) goto LAB_00130873;
      uVar20 = *(uint *)(puVar9 + -1);
      fVar13 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                      uVar20 << 0x18);
      if ((fVar13 != fStack_964) || (NAN(fVar13) || NAN(fStack_964))) {
        pcStack_988 = (code *)0x130897;
        test_read_num<long,int,int(*)(char_const**,long*)>();
        goto LAB_00130897;
      }
      puVar25 = puVar9 + 3;
      goto LAB_001306c7;
    }
    if (mVar3 == MP_INT) {
      puVar32 = &switchD_0013059d::switchdataD_00139b0c;
      switch(bVar2) {
      case 0xd0:
        uVar19 = (ulong)(char)puVar9[-1];
        break;
      case 0xd1:
        uVar19 = (ulong)(short)(*(ushort *)(puVar9 + -1) << 8 | *(ushort *)(puVar9 + -1) >> 8);
        puVar25 = auStack_947 + lVar7 + -6;
        break;
      case 0xd2:
        uVar20 = *(uint *)(puVar9 + -1);
        uVar19 = (ulong)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                             uVar20 << 0x18);
        puVar25 = auStack_947 + lVar7 + -4;
        break;
      case 0xd3:
        uVar19 = *(ulong *)(puVar9 + -1);
        uVar19 = uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                 (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                 (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                 (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38;
        puVar25 = auStack_947 + lVar7;
        break;
      default:
        if (bVar2 < 0xe0) {
          pcStack_988 = (code *)0x13085f;
          test_read_num<long,int,int(*)(char_const**,long*)>();
          goto LAB_0013085f;
        }
        uVar19 = uVar22;
        puVar25 = auStack_947 + lVar7 + -8;
        puVar32 = (uint *)pcVar17;
      }
      if (uVar19 == uVar36) goto LAB_001306c7;
      pcStack_988 = (code *)0x1308bb;
      test_read_num<long,int,int(*)(char_const**,long*)>();
      goto LAB_001308bb;
    }
    if (bVar2 != 0xcb) {
LAB_00130897:
      pcStack_988 = (code *)0x1308b6;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    uVar36 = *(ulong *)(puVar9 + -1);
    dVar16 = (double)(uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
                      (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
                      (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 |
                      (uVar36 & 0xff00) << 0x28 | uVar36 << 0x38);
    if ((dVar16 == dStack_960) && (!NAN(dVar16) && !NAN(dStack_960))) {
      puVar25 = auStack_947 + lVar7;
      goto LAB_001306c7;
    }
    goto LAB_0013086e;
  }
  puVar32 = &switchD_001305fc::switchdataD_00139afc;
  switch(bVar2) {
  case 0xcc:
    uVar19 = (ulong)(byte)puVar9[-1];
    break;
  case 0xcd:
    uVar19 = (ulong)(ushort)(*(ushort *)(puVar9 + -1) << 8 | *(ushort *)(puVar9 + -1) >> 8);
    puVar25 = auStack_947 + lVar7 + -6;
    break;
  case 0xce:
    uVar20 = *(uint *)(puVar9 + -1);
    uVar19 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                    uVar20 << 0x18);
    puVar25 = auStack_947 + lVar7 + -4;
    break;
  case 0xcf:
    uVar19 = *(ulong *)(puVar9 + -1);
    uVar19 = uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
             (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
             (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 | (uVar19 & 0xff00) << 0x28 |
             uVar19 << 0x38;
    puVar25 = auStack_947 + lVar7;
    break;
  default:
    if (-1 < (char)bVar2) {
      puVar25 = auStack_947 + lVar7 + -8;
      puVar32 = (uint *)pcVar17;
      break;
    }
LAB_0013085f:
    pcStack_988 = (code *)0x130864;
    test_read_num<long,int,int(*)(char_const**,long*)>();
    goto LAB_00130864;
  }
  if (uVar19 != uVar36) {
LAB_001308bb:
    uVar28 = SUB84(puVar25,0);
    pcStack_988 = test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>;
    test_read_num<long,int,int(*)(char_const**,long*)>();
    builtin_strncpy(acStack_ab8,"typed read of ",0xf);
    pcStack_bf0 = (code *)0x130920;
    uStack_bdc = uVar28;
    uStack_9b0 = uVar22;
    uStack_9a8 = uVar36;
    pcStack_9a0 = pcVar37;
    pacStack_998 = (char (*) [16])pcVar38;
    puStack_990 = puVar9;
    pcStack_988 = (code *)uVar27;
    iVar4 = snprintf(acStack_ab8 + 0xe,0xf2,"%llu",puVar32);
    pcVar17 = acStack_ab8 + (long)iVar4 + 0xe;
    pcStack_bf0 = (code *)0x130944;
    iVar4 = snprintf(pcVar17,(size_t)(auStack_9b8 + -(long)pcVar17)," into ");
    pcStack_bf0 = (code *)0x130963;
    snprintf(pcVar17 + iVar4,(size_t)(auStack_9b8 + -(long)(pcVar17 + iVar4)),"int%zu_t",0x40);
    pcStack_bf0 = (code *)0x130972;
    _space((FILE *)_stdout);
    pcStack_bf0 = (code *)0x13098b;
    fwrite("# ",2,1,_stdout);
    pcStack_bf0 = (code *)0x13099b;
    fputs(acStack_ab8,_stdout);
    pcStack_bf0 = (code *)0x1309a8;
    fputc(10,_stdout);
    pcStack_bf0 = (code *)0x1309b5;
    pcVar17 = (char *)puVar32;
    uVar20 = test_encode_uint_all_sizes((char (*) [16])acStack_bb8,(uint64_t)puVar32);
    if (-1 < (long)puVar32) {
      pcVar17 = (char *)0x7fffffffffffffff;
      pcStack_bf0 = (code *)0x1309e0;
      iVar4 = test_encode_int_all_sizes
                        ((char (*) [16])(acStack_bb8 + (long)(int)uVar20 * 0x10),0x7fffffffffffffff)
      ;
      uVar20 = uVar20 + iVar4;
    }
    if ((int)uVar20 < 1) {
      return;
    }
    fStack_be0 = (float)puVar32;
    auVar41._8_4_ = (int)((ulong)puVar32 >> 0x20);
    auVar41._0_8_ = puVar32;
    auVar41._12_4_ = 0x45300000;
    dStack_bc0 = auVar41._8_8_ - 1.9342813113834067e+25;
    dStack_bc8 = dStack_bc0 + ((double)CONCAT44(0x43300000,(int)puVar32) - 4503599627370496.0);
    uVar36 = (ulong)uVar20;
    pcVar38 = acStack_bb8 + 2;
    pcVar30 = (char *)0x0;
    pcStack_bd8 = (char *)puVar32;
    goto LAB_00130a52;
  }
LAB_001306c7:
  puVar11 = puVar9 + -2;
  puStack_958 = puVar25;
  switch(bVar2) {
  case 0xcc:
    uVar22 = (ulong)(byte)puVar9[-1];
    goto LAB_00130702;
  case 0xcd:
    puVar11 = auStack_947 + lVar7 + -6;
    uVar22 = (ulong)(ushort)(*(ushort *)(puVar9 + -1) << 8 | *(ushort *)(puVar9 + -1) >> 8);
    break;
  case 0xce:
    uVar20 = *(uint *)(puVar9 + -1);
    uVar22 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                    uVar20 << 0x18);
    puVar11 = auStack_947 + lVar7 + -4;
    break;
  case 0xcf:
    uVar36 = *(ulong *)(puVar9 + -1);
    uVar22 = uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
             (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
             (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 | (uVar36 & 0xff00) << 0x28 |
             uVar36 << 0x38;
    if (-1 < (long)uVar22) goto LAB_0013072c;
LAB_0013083f:
    uVar22 = 0;
    iVar4 = 0;
    goto LAB_0013077a;
  case 0xd0:
    uVar22 = (ulong)(char)puVar9[-1];
LAB_00130702:
    puVar11 = auStack_947 + lVar7 + -7;
    break;
  case 0xd1:
    puVar11 = auStack_947 + lVar7 + -6;
    uVar22 = (ulong)(short)(*(ushort *)(puVar9 + -1) << 8 | *(ushort *)(puVar9 + -1) >> 8);
    break;
  case 0xd2:
    uVar20 = *(uint *)(puVar9 + -1);
    puVar11 = auStack_947 + lVar7 + -4;
    uVar22 = (ulong)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                         uVar20 << 0x18);
    break;
  case 0xd3:
    uVar36 = *(ulong *)(puVar9 + -1);
    uVar22 = uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
             (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
             (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 | (uVar36 & 0xff00) << 0x28 |
             uVar36 << 0x38;
LAB_0013072c:
    puVar11 = auStack_947 + lVar7;
    break;
  default:
    if ((char)bVar2 < -0x20) goto LAB_0013083f;
    puVar11 = auStack_947 + lVar7 + -8;
  }
  iVar4 = 1;
LAB_0013077a:
  pcVar38 = "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  pcStack_988 = (code *)0x13079e;
  _ok(iVar4,"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
  pcStack_988 = (code *)0x1307c6;
  _ok((uint)(puStack_958 == puVar11),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  uVar36 = uStack_970;
  if ((int)uStack_974 < 0) {
    if (-1 < (long)uVar22) goto LAB_00130869;
    pcVar30 = "(int64_t)num1 == (int64_t)num2";
    iVar4 = 0x746;
  }
  else {
    if ((long)uVar22 < 0) {
LAB_00130864:
      pcStack_988 = (code *)0x130869;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_00130869:
      pcStack_988 = (code *)0x13086e;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_0013086e:
      pcStack_988 = (code *)0x130873;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_00130873:
      pcStack_988 = (code *)0x130892;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    pcVar30 = "(uint64_t)num1 == (uint64_t)num2";
    iVar4 = 0x743;
  }
  pcVar17 = (char *)(ulong)(uVar22 == uStack_970);
  pcStack_988 = (code *)0x13082d;
  _ok((uint)(uVar22 == uStack_970),pcVar30,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar4,
      "check int number");
  pcVar37 = pcVar37 + 1;
  puVar9 = puVar9 + 0x10;
  uVar27 = uVar27 - 1;
  if (uVar27 == 0) {
    return;
  }
  goto LAB_00130547;
LAB_00130a52:
  lVar7 = (long)pcVar30 * 0x10;
  bVar2 = pcVar38[-2];
  pcVar18 = (char *)(ulong)bVar2;
  pcVar33 = (char *)(long)(char)bVar2;
  mVar3 = mp_type_hint[(long)pcVar18];
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pcVar18 = (char *)(ulong)(byte)pcVar38[-1];
      pcVar17 = pcVar38;
      break;
    case 0xcd:
      pcVar18 = (char *)(ulong)(ushort)(*(ushort *)(pcVar38 + -1) << 8 |
                                       *(ushort *)(pcVar38 + -1) >> 8);
      pcVar17 = acStack_bb8 + lVar7 + 3;
      break;
    case 0xce:
      uVar20 = *(uint *)(pcVar38 + -1);
      pcVar18 = (char *)(ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                               uVar20 << 0x18);
      pcVar17 = acStack_baf + lVar7 + -4;
      break;
    case 0xcf:
      uVar27 = *(ulong *)(pcVar38 + -1);
      pcVar18 = (char *)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                         (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                         (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                         (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
      pcVar17 = acStack_baf + lVar7;
      break;
    default:
      if (-1 < (char)bVar2) {
        pcVar17 = acStack_bb8 + lVar7 + 1;
        break;
      }
LAB_00130db7:
      pcStack_bf0 = (code *)0x130dbc;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_00130dbc;
    }
    if ((uint *)pcVar18 != puVar32) {
LAB_00130e0e:
      pcStack_bf0 = test_read_num<double,int,int(*)(char_const**,double*)>;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      pcStack_c00 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      iVar4 = (int)puVar32;
      builtin_strncpy(acStack_d20,"typed read of ",0xf);
      pcStack_e50 = (code *)(long)iVar4;
      if (iVar4 < 0) {
        pcVar18 = "%lld";
        pcVar15 = pcStack_e50;
      }
      else {
        pcVar18 = "%llu";
        pcVar15 = (code *)((ulong)puVar32 & 0xffffffff);
      }
      pcStack_e58 = (code *)0x130e95;
      pacStack_e28 = (char (*) [16])pcVar17;
      pacStack_c18 = (char (*) [16])pcVar30;
      pcStack_c10 = pcVar38;
      pcStack_c08 = pcVar37;
      pcStack_bf8 = acStack_bb8 + lVar7;
      pcStack_bf0 = (code *)uVar36;
      iVar5 = snprintf(acStack_d20 + 0xe,0xf2,pcVar18,pcVar15);
      pcVar17 = acStack_d20 + 0xe + iVar5;
      iVar6 = 0;
      pcStack_e58 = (code *)0x130eb4;
      iVar5 = snprintf(pcVar17,(size_t)(auStack_c20 + -(long)pcVar17)," into ");
      puVar9 = auStack_c20 + -(long)(pcVar17 + iVar5);
      pcStack_e58 = (code *)0x130ece;
      snprintf(pcVar17 + iVar5,(size_t)puVar9,"double");
      pcStack_e58 = (code *)0x130edd;
      _space((FILE *)_stdout);
      pcStack_e58 = (code *)0x130ef6;
      fwrite("# ",2,1,_stdout);
      pcStack_e58 = (code *)0x130f06;
      fputs(acStack_d20,_stdout);
      pcStack_e58 = (code *)0x130f13;
      fputc(10,_stdout);
      if (-1 < iVar4) {
        pcStack_e58 = (code *)0x130f24;
        iVar6 = test_encode_uint_all_sizes
                          ((char (*) [16])&bStack_e20,(uint64_t)((ulong)puVar32 & 0xffffffff));
      }
      pcVar38 = (char *)(&bStack_e20 + (long)iVar6 * 0x10);
      pcStack_e58 = (code *)0x130f42;
      pcVar17 = (char *)pcStack_e50;
      iVar5 = test_encode_int_all_sizes((char (*) [16])pcVar38,(int64_t)pcStack_e50);
      uVar20 = iVar6 + iVar5;
      if (uVar20 == 0 || SCARRY4(iVar6,iVar5) != (int)uVar20 < 0) {
        return;
      }
      fStack_e44 = (float)iVar4;
      dStack_e40 = (double)iVar4;
      uVar36 = (ulong)uVar20;
      puVar34 = (undefined8 *)(auStack_e1f + 1);
      pcVar37 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      lVar7 = 0;
      goto LAB_00130f73;
    }
  }
  else {
    if (mVar3 == MP_FLOAT) {
      if (bVar2 != 0xca) {
LAB_00130de5:
        pcStack_bf0 = (code *)0x130e04;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar20 = *(uint *)(pcVar38 + -1);
      fVar13 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                      uVar20 << 0x18);
      if ((fVar13 == fStack_be0) && (!NAN(fVar13) && !NAN(fStack_be0))) {
        pcVar17 = pcVar38 + 3;
        goto LAB_00130bdc;
      }
      pcStack_bf0 = (code *)0x130e09;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00130e09:
      pcStack_bf0 = (code *)0x130e0e;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_00130e0e;
    }
    if (mVar3 == MP_INT) {
      switch(bVar2) {
      case 0xd0:
        pcVar18 = (char *)(long)pcVar38[-1];
        pcVar17 = pcVar38;
        break;
      case 0xd1:
        pcVar18 = (char *)(long)(short)(*(ushort *)(pcVar38 + -1) << 8 |
                                       *(ushort *)(pcVar38 + -1) >> 8);
        pcVar17 = acStack_bb8 + lVar7 + 3;
        break;
      case 0xd2:
        uVar20 = *(uint *)(pcVar38 + -1);
        pcVar18 = (char *)(long)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                      (uVar20 & 0xff00) << 8 | uVar20 << 0x18);
        pcVar17 = acStack_baf + lVar7 + -4;
        break;
      case 0xd3:
        uVar27 = *(ulong *)(pcVar38 + -1);
        pcVar18 = (char *)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                           (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                           (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                           (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
        pcVar17 = acStack_baf + lVar7;
        break;
      default:
        if (bVar2 < 0xe0) {
          pcStack_bf0 = (code *)0x130db7;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
          goto LAB_00130db7;
        }
        pcVar18 = pcVar33;
        pcVar17 = acStack_bb8 + lVar7 + 1;
      }
      if ((uint *)pcVar18 != puVar32) goto LAB_00130e09;
    }
    else {
      if (bVar2 != 0xcb) goto LAB_00130dc1;
      uVar27 = *(ulong *)(pcVar38 + -1);
      dVar16 = (double)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                        (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                        (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                        (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
      if ((dVar16 != dStack_bc8) || (NAN(dVar16) || NAN(dStack_bc8))) {
        pcStack_bf0 = (code *)0x130de5;
        test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
        goto LAB_00130de5;
      }
      pcVar17 = acStack_baf + lVar7;
    }
  }
LAB_00130bdc:
  pcVar37 = pcVar38 + -2;
  switch(bVar2) {
  case 0xcc:
    pcVar33 = (char *)(ulong)(byte)pcVar38[-1];
    goto LAB_00130c11;
  case 0xcd:
    pcVar18 = acStack_bb8 + lVar7 + 3;
    pcVar33 = (char *)(ulong)(ushort)(*(ushort *)(pcVar38 + -1) << 8 |
                                     *(ushort *)(pcVar38 + -1) >> 8);
    break;
  case 0xce:
    uVar20 = *(uint *)(pcVar38 + -1);
    pcVar33 = (char *)(ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                             uVar20 << 0x18);
    pcVar18 = acStack_baf + lVar7 + -4;
    break;
  case 0xcf:
    uVar27 = *(ulong *)(pcVar38 + -1);
    pcVar33 = (char *)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                       (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                       (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                       (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
    if (-1 < (long)pcVar33) goto LAB_00130c3f;
LAB_00130d8e:
    pcVar33 = (char *)0x0;
    iVar5 = 1;
    iVar4 = 0;
    pcVar18 = pcVar37;
    goto LAB_00130c91;
  case 0xd0:
    pcVar33 = (char *)(long)pcVar38[-1];
LAB_00130c11:
    pcVar18 = acStack_bb8 + lVar7 + 2;
    break;
  case 0xd1:
    pcVar18 = acStack_bb8 + lVar7 + 3;
    pcVar33 = (char *)(long)(short)(*(ushort *)(pcVar38 + -1) << 8 | *(ushort *)(pcVar38 + -1) >> 8)
    ;
    break;
  case 0xd2:
    uVar20 = *(uint *)(pcVar38 + -1);
    pcVar18 = acStack_baf + lVar7 + -4;
    pcVar33 = (char *)(long)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8
                                 | uVar20 << 0x18);
    break;
  case 0xd3:
    uVar27 = *(ulong *)(pcVar38 + -1);
    pcVar33 = (char *)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                       (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                       (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                       (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
LAB_00130c3f:
    pcVar18 = acStack_baf + lVar7;
    break;
  default:
    if ((char)bVar2 < -0x20) goto LAB_00130d8e;
    pcVar18 = acStack_bb8 + lVar7 + 1;
  }
  iVar4 = 1;
  iVar5 = 0;
LAB_00130c91:
  if ((char)uStack_bdc == '\0') {
    pcStack_bf0 = (code *)0x130d51;
    _ok(iVar5,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    pcVar17 = "mp_num_pos2 == mp_nums[i]";
    pcStack_bf0 = (code *)0x130d77;
    _ok((uint)(pcVar37 == pcVar18),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
    puVar32 = (uint *)pcStack_bd8;
  }
  else {
    pcStack_bf0 = (code *)0x130ccd;
    pcStack_bd0 = pcVar38;
    _ok(iVar4,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    pcStack_bf0 = (code *)0x130cf3;
    _ok((uint)(pcVar17 == pcVar18),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    puVar32 = (uint *)pcStack_bd8;
    if ((long)pcVar33 < 0) {
LAB_00130dbc:
      pcStack_bf0 = (code *)0x130dc1;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00130dc1:
      pcStack_bf0 = (code *)0x130de0;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    pcVar17 = "(uint64_t)num1 == (uint64_t)num2";
    pcStack_bf0 = (code *)0x130d27;
    _ok((uint)(pcVar33 == pcStack_bd8),"(uint64_t)num1 == (uint64_t)num2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x743,"check int number");
    pcVar38 = pcStack_bd0;
    pcVar37 = pcVar30;
  }
  pcVar30 = pcVar30 + 1;
  pcVar38 = pcVar38 + 0x10;
  uVar36 = uVar36 - 1;
  if (uVar36 == 0) {
    return;
  }
  goto LAB_00130a52;
LAB_00130f73:
  lVar8 = lVar7 * 0x10;
  bVar2 = *(byte *)((long)puVar34 + -2);
  pcVar15 = (code *)(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pcVar15];
  puVar23 = puVar34;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pcVar15 = (code *)(ulong)*(byte *)((long)puVar34 + -1);
      break;
    case 0xcd:
      pcVar15 = (code *)(ulong)(ushort)(*(ushort *)((long)puVar34 + -1) << 8 |
                                       *(ushort *)((long)puVar34 + -1) >> 8);
      puVar23 = (undefined8 *)((long)auStack_e17 + lVar8 + -6);
      break;
    case 0xce:
      uVar20 = *(uint *)((long)puVar34 + -1);
      pcVar15 = (code *)(ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                               uVar20 << 0x18);
      puVar23 = (undefined8 *)((long)auStack_e17 + lVar8 + -4);
      break;
    case 0xcf:
      uVar27 = *(ulong *)((long)puVar34 + -1);
      pcVar15 = (code *)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                         (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                         (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                         (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
      puVar23 = auStack_e17 + lVar7 * 2;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_001311cd:
        pcStack_e58 = (code *)0x1311d2;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001311d2:
        pcStack_e58 = (code *)0x1311d7;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001311d7:
        pcStack_e58 = (code *)0x1311f6;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar23 = auStack_e17 + lVar7 * 2 + -1;
    }
    if (pcVar15 != pcStack_e50) {
      pcStack_e58 = (code *)0x13121f;
      test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_0013121f:
      pcStack_e58 = test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      pcStack_e58 = (code *)0x139f88;
      builtin_strncpy(acStack_f88,"typed read of ",0xf);
      pcStack_10c0 = (code *)0x13128b;
      uStack_10a4 = extraout_EDX;
      pcStack_1090 = (code *)pcVar17;
      puStack_e80 = puVar23;
      uStack_e78 = uVar36;
      puStack_e70 = puVar34;
      lStack_e68 = lVar7;
      puStack_e60 = puVar9;
      iVar4 = snprintf(acStack_f88 + 0xe,0xf2,"%llu",pcVar38);
      pcVar17 = acStack_f88 + (long)iVar4 + 0xe;
      pcStack_10c0 = (code *)0x1312af;
      iVar4 = snprintf(pcVar17,(size_t)(auStack_e88 + -(long)pcVar17)," into ");
      pcStack_10c0 = (code *)0x1312c9;
      snprintf(pcVar17 + iVar4,(size_t)(auStack_e88 + -(long)(pcVar17 + iVar4)),"double");
      pcStack_10c0 = (code *)0x1312d8;
      _space((FILE *)_stdout);
      pcStack_10c0 = (code *)0x1312f1;
      fwrite("# ",2,1,_stdout);
      pcStack_10c0 = (code *)0x131301;
      fputs(acStack_f88,_stdout);
      pcStack_10c0 = (code *)0x13130e;
      fputc(10,_stdout);
      pcStack_10c0 = (code *)0x13131b;
      iVar4 = test_encode_uint_all_sizes((char (*) [16])&bStack_1088,(uint64_t)pcVar38);
      pacVar14 = (char (*) [16])(&bStack_1088 + (long)iVar4 * 0x10);
      pcStack_10c0 = (code *)0x131339;
      pacStack_10b8 = (char (*) [16])pcVar38;
      iVar5 = test_encode_int_all_sizes(pacVar14,(int64_t)pcVar38);
      uVar20 = iVar4 + iVar5;
      if (uVar20 == 0 || SCARRY4(iVar4,iVar5) != (int)uVar20 < 0) {
        return;
      }
      fStack_10a8 = (float)(long)pacStack_10b8;
      dStack_10a0 = (double)(long)pacStack_10b8;
      uVar36 = (ulong)uVar20;
      pcVar30 = (char *)((long)&uStack_1087 + 1);
      lVar7 = 0;
      goto LAB_00131368;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_001311fb:
      pcStack_e58 = (code *)0x13121a;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar20 = *(uint *)((long)puVar34 + -1);
    fVar13 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                    uVar20 << 0x18);
    if ((fVar13 != fStack_e44) || (NAN(fVar13) || NAN(fStack_e44))) goto LAB_001311d2;
    puVar23 = (undefined8 *)((long)puVar34 + 3);
  }
  else if (mVar3 == MP_INT) {
    pcVar15 = (code *)(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pcVar15 = (code *)(long)*(char *)((long)puVar34 + -1);
      pcVar17 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd1:
      pcVar15 = (code *)(long)(short)(*(ushort *)((long)puVar34 + -1) << 8 |
                                     *(ushort *)((long)puVar34 + -1) >> 8);
      puVar23 = (undefined8 *)((long)auStack_e17 + lVar8 + -6);
      pcVar17 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd2:
      uVar20 = *(uint *)((long)puVar34 + -1);
      pcVar15 = (code *)(long)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                    (uVar20 & 0xff00) << 8 | uVar20 << 0x18);
      puVar23 = (undefined8 *)((long)auStack_e17 + lVar8 + -4);
      pcVar17 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd3:
      uVar27 = *(ulong *)((long)puVar34 + -1);
      pcVar15 = (code *)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                         (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                         (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                         (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
      puVar23 = auStack_e17 + lVar7 * 2;
      pcVar17 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_e58 = (code *)0x1311cd;
        test_read_num<double,int,int(*)(char_const**,double*)>();
        goto LAB_001311cd;
      }
      puVar23 = auStack_e17 + lVar7 * 2 + -1;
    }
    if (pcVar15 != pcStack_e50) goto LAB_0013121f;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_001311d7;
    uVar27 = *(ulong *)((long)puVar34 + -1);
    dVar16 = (double)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                      (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                      (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                      (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
    if ((dVar16 != dStack_e40) || (NAN(dVar16) || NAN(dStack_e40))) {
      pcStack_e58 = (code *)0x1311fb;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      goto LAB_001311fb;
    }
    puVar23 = auStack_e17 + lVar7 * 2;
  }
  puStack_e30 = (undefined8 *)((long)puVar34 + -2);
  puVar9 = (undefined1 *)(ulong)(uint)(int)(char)bVar2;
  dStack_e38 = 0.0;
  pcStack_e58 = (code *)0x131113;
  iVar4 = (*(code *)pacStack_e28)(&puStack_e30,&dStack_e38);
  pcStack_e58 = (code *)0x13113b;
  _ok((uint)(iVar4 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar9);
  pcStack_e58 = (code *)0x131163;
  _ok((uint)(puVar23 == puStack_e30),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar40 = ABS(dStack_e40 - dStack_e38) < 1e-15;
  pcVar38 = (char *)(ulong)bVar40;
  pcVar17 = "double_eq(num1, num2)";
  pcStack_e58 = (code *)0x1311a6;
  _ok((uint)bVar40,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar7 = lVar7 + 1;
  puVar34 = puVar34 + 2;
  uVar36 = uVar36 - 1;
  if (uVar36 == 0) {
    return;
  }
  goto LAB_00130f73;
LAB_00131368:
  lVar8 = lVar7 * 0x10;
  bVar2 = pcVar30[-2];
  pacVar10 = (char (*) [16])(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pacVar10];
  pcVar18 = pcVar30;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pacVar10 = (char (*) [16])(ulong)(byte)pcVar30[-1];
      break;
    case 0xcd:
      pacVar10 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar30 + -1) << 8 | *(ushort *)(pcVar30 + -1) >> 8);
      pcVar18 = acStack_107f + lVar8 + -6;
      break;
    case 0xce:
      uVar20 = *(uint *)(pcVar30 + -1);
      pacVar10 = (char (*) [16])
                 (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                        uVar20 << 0x18);
      pcVar18 = acStack_107f + lVar8 + -4;
      break;
    case 0xcf:
      uVar27 = *(ulong *)(pcVar30 + -1);
      pacVar10 = (char (*) [16])
                 (uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                  (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                  (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                  (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
      pcVar18 = acStack_107f + lVar7 * 0x10;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_00131627:
        pcStack_10c0 = (code *)0x13162c;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_0013162c:
        pcStack_10c0 = (code *)0x131631;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00131631:
        pcStack_10c0 = (code *)0x131650;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar18 = acStack_107f + (lVar7 * 2 + -1) * 8;
    }
    if (pacVar10 != pacStack_10b8) {
      pcStack_10c0 = (code *)0x131679;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00131679:
      pcStack_10c0 = test_read_num<double,long_long,int(*)(char_const**,double*)>;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_12f0,"typed read of ",0xf);
      pcStack_1328 = (code *)0x1316e2;
      uStack_130c = extraout_EDX_00;
      pacStack_12f8 = (char (*) [16])pcVar38;
      lStack_10e8 = lVar7;
      uStack_10e0 = uVar36;
      pcStack_10d8 = pcVar17;
      pcStack_10d0 = pcVar18;
      pcStack_10c8 = pcVar30;
      pcStack_10c0 = (code *)pcVar37;
      iVar4 = snprintf(acStack_12f0 + 0xe,0xf2,"%lld",pacVar14);
      pcVar17 = acStack_12f0 + (long)iVar4 + 0xe;
      pcStack_1328 = (code *)0x131703;
      iVar4 = snprintf(pcVar17,(size_t)(&bStack_11f0 + -(long)pcVar17)," into ");
      pcStack_1328 = (code *)0x13171d;
      snprintf(pcVar17 + iVar4,(size_t)(&bStack_11f0 + -(long)(pcVar17 + iVar4)),"double");
      pcStack_1328 = (code *)0x13172c;
      _space((FILE *)_stdout);
      pcStack_1328 = (code *)0x131745;
      fwrite("# ",2,1,_stdout);
      pcStack_1328 = (code *)0x131752;
      fputs(acStack_12f0,_stdout);
      pcStack_1328 = (code *)0x13175f;
      fputc(10,_stdout);
      pacVar10 = (char (*) [16])&bStack_11f0;
      pcStack_1328 = (code *)0x131773;
      pacStack_1320 = pacVar14;
      uVar20 = test_encode_int_all_sizes(pacVar10,(int64_t)pacVar14);
      if ((int)uVar20 < 1) {
        return;
      }
      fStack_1310 = (float)(long)pacStack_1320;
      dStack_1308 = (double)(long)pacStack_1320;
      uVar36 = (ulong)uVar20;
      pcVar38 = (char *)((long)&uStack_11ef + 1);
      lVar7 = 0;
      goto LAB_001317a5;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_00131655:
      pcStack_10c0 = (code *)0x131674;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar20 = *(uint *)(pcVar30 + -1);
    fVar13 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                    uVar20 << 0x18);
    if ((fVar13 != fStack_10a8) || (NAN(fVar13) || NAN(fStack_10a8))) goto LAB_0013162c;
    pcVar18 = pcVar30 + 3;
  }
  else if (mVar3 == MP_INT) {
    pacVar10 = (char (*) [16])(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pacVar10 = (char (*) [16])(long)pcVar30[-1];
      pcVar38 = (char *)&switchD_001313bd::switchdataD_00139bac;
      break;
    case 0xd1:
      pacVar10 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar30 + -1) << 8 | *(ushort *)(pcVar30 + -1) >> 8);
      pcVar38 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar18 = acStack_107f + lVar8 + -6;
      break;
    case 0xd2:
      uVar20 = *(uint *)(pcVar30 + -1);
      pacVar10 = (char (*) [16])
                 (long)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                            uVar20 << 0x18);
      pcVar38 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar18 = acStack_107f + lVar8 + -4;
      break;
    case 0xd3:
      uVar27 = *(ulong *)(pcVar30 + -1);
      pacVar10 = (char (*) [16])
                 (uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                  (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                  (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                  (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
      pcVar38 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar18 = acStack_107f + lVar7 * 0x10;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_10c0 = (code *)0x131627;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
        goto LAB_00131627;
      }
      pcVar18 = acStack_107f + (lVar7 * 2 + -1) * 8;
    }
    if (pacVar10 != pacStack_10b8) goto LAB_00131679;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_00131631;
    uVar27 = *(ulong *)(pcVar30 + -1);
    dVar16 = (double)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                      (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                      (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                      (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
    if ((dVar16 != dStack_10a0) || (NAN(dVar16) || NAN(dStack_10a0))) {
      pcStack_10c0 = (code *)0x131655;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      goto LAB_00131655;
    }
    pcVar18 = acStack_107f + lVar7 * 0x10;
  }
  pcVar37 = pcVar30 + -2;
  pcVar17 = (char *)(ulong)(uint)(int)(char)bVar2;
  dStack_1098 = 0.0;
  pcStack_10c0 = (code *)0x131508;
  pcStack_10b0 = pcVar37;
  iVar4 = (*pcStack_1090)(&pcStack_10b0,&dStack_1098);
  if ((char)uStack_10a4 == '\0') {
    pcStack_10c0 = (code *)0x1315d8;
    _ok((uint)(iVar4 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar17);
    bVar40 = pcVar37 == pcStack_10b0;
    pcVar38 = "mp_num_pos2 == mp_nums[i]";
    iVar4 = 0x738;
    pcVar18 = "check position";
  }
  else {
    pcVar37 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_10c0 = (code *)0x131542;
    _ok((uint)(iVar4 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar17);
    pcStack_10c0 = (code *)0x13156a;
    _ok((uint)(pcVar18 == pcStack_10b0),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar40 = ABS(dStack_10a0 - dStack_1098) < 1e-15;
    pcVar38 = "double_eq(num1, num2)";
    iVar4 = 0x73e;
    pcVar18 = "check float number";
  }
  pacVar14 = (char (*) [16])(ulong)bVar40;
  pcStack_10c0 = (code *)0x131600;
  _ok((uint)bVar40,pcVar38,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar4,
      pcVar18);
  lVar7 = lVar7 + 1;
  pcVar30 = pcVar30 + 0x10;
  uVar36 = uVar36 - 1;
  if (uVar36 == 0) {
    return;
  }
  goto LAB_00131368;
LAB_001317a5:
  lVar8 = lVar7 * 0x10;
  bVar2 = pcVar38[-2];
  pacVar14 = (char (*) [16])(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pacVar14];
  pcVar30 = pcVar38;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pacVar14 = (char (*) [16])(ulong)(byte)pcVar38[-1];
      break;
    case 0xcd:
      pacVar14 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar38 + -1) << 8 | *(ushort *)(pcVar38 + -1) >> 8);
      pcVar30 = acStack_11e7 + lVar8 + -6;
      break;
    case 0xce:
      uVar20 = *(uint *)(pcVar38 + -1);
      pacVar14 = (char (*) [16])
                 (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                        uVar20 << 0x18);
      pcVar30 = acStack_11e7 + lVar8 + -4;
      break;
    case 0xcf:
      uVar27 = *(ulong *)(pcVar38 + -1);
      pacVar14 = (char (*) [16])
                 (uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                  (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                  (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                  (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
      pcVar30 = acStack_11e7 + lVar7 * 0x10;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_00131a67:
        pcStack_1328 = (code *)0x131a6c;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a6c:
        pcStack_1328 = (code *)0x131a71;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a71:
        pcStack_1328 = (code *)0x131a90;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar30 = acStack_11e7 + (lVar7 * 2 + -1) * 8;
    }
    if (pacVar14 != pacStack_1320) {
      pcStack_1328 = (code *)0x131ab9;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131ab9:
      pcStack_1328 = test_read_num<double,float,int(*)(char_const**,double*)>;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_1558,"typed read of ",0xf);
      pcStack_1580 = (code *)0x131b1e;
      pacStack_1560 = pacVar10;
      lStack_1350 = lVar7;
      uStack_1348 = uVar36;
      pcStack_1340 = pcVar17;
      pcStack_1338 = pcVar30;
      pcStack_1330 = pcVar38;
      pcStack_1328 = (code *)pcVar37;
      iVar4 = snprintf(acStack_1558 + 0xe,0xf2,"%f",0x41590b2200000000);
      pcVar17 = acStack_1558 + (long)iVar4 + 0xe;
      pcStack_1580 = (code *)0x131b3f;
      iVar4 = snprintf(pcVar17,(size_t)(&bStack_1458 + -(long)pcVar17)," into ");
      pbVar26 = &bStack_1458 + -(long)(pcVar17 + iVar4);
      pcStack_1580 = (code *)0x131b59;
      snprintf(pcVar17 + iVar4,(size_t)pbVar26,"double");
      pcStack_1580 = (code *)0x131b68;
      _space((FILE *)_stdout);
      lVar8 = 1;
      pcStack_1580 = (code *)0x131b87;
      fwrite("# ",2,1,_stdout);
      pcStack_1580 = (code *)0x131b94;
      fputs(acStack_1558,_stdout);
      pcVar15 = (code *)0xa;
      pcStack_1580 = (code *)0x131ba1;
      fputc(10,_stdout);
      puVar34 = (undefined8 *)(auStack_1457 + 1);
      bStack_1458 = 0xca;
      _auStack_1457 = 0x1059c84a;
      uStack_144f._7_1_ = 0xcb;
      uStack_1447 = 0x220b5941;
      lVar7 = 0;
      goto LAB_00131bd0;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_00131a95:
      pcStack_1328 = (code *)0x131ab4;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar20 = *(uint *)(pcVar38 + -1);
    fVar13 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                    uVar20 << 0x18);
    if ((fVar13 != fStack_1310) || (NAN(fVar13) || NAN(fStack_1310))) goto LAB_00131a6c;
    pcVar30 = pcVar38 + 3;
  }
  else if (mVar3 == MP_INT) {
    pacVar14 = (char (*) [16])(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pacVar14 = (char (*) [16])(long)pcVar38[-1];
      break;
    case 0xd1:
      pacVar14 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar38 + -1) << 8 | *(ushort *)(pcVar38 + -1) >> 8);
      pcVar30 = acStack_11e7 + lVar8 + -6;
      break;
    case 0xd2:
      uVar20 = *(uint *)(pcVar38 + -1);
      pacVar14 = (char (*) [16])
                 (long)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                            uVar20 << 0x18);
      pcVar30 = acStack_11e7 + lVar8 + -4;
      break;
    case 0xd3:
      uVar27 = *(ulong *)(pcVar38 + -1);
      pacVar14 = (char (*) [16])
                 (uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                  (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                  (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                  (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
      pcVar30 = acStack_11e7 + lVar7 * 0x10;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_1328 = (code *)0x131a67;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
        goto LAB_00131a67;
      }
      pcVar30 = acStack_11e7 + (lVar7 * 2 + -1) * 8;
    }
    if (pacVar14 != pacStack_1320) goto LAB_00131ab9;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_00131a71;
    uVar27 = *(ulong *)(pcVar38 + -1);
    dVar16 = (double)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                      (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                      (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                      (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
    if ((dVar16 != dStack_1308) || (NAN(dVar16) || NAN(dStack_1308))) {
      pcStack_1328 = (code *)0x131a95;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      goto LAB_00131a95;
    }
    pcVar30 = acStack_11e7 + lVar7 * 0x10;
  }
  pcVar37 = pcVar38 + -2;
  pcVar17 = (char *)(ulong)(uint)(int)(char)bVar2;
  dStack_1300 = 0.0;
  pcStack_1328 = (code *)0x131948;
  pcStack_1318 = pcVar37;
  iVar4 = (*(code *)pacStack_12f8)(&pcStack_1318,&dStack_1300);
  if ((char)uStack_130c == '\0') {
    pcStack_1328 = (code *)0x131a18;
    _ok((uint)(iVar4 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar17);
    bVar40 = pcVar37 == pcStack_1318;
    pcVar30 = "mp_num_pos2 == mp_nums[i]";
    iVar4 = 0x738;
    pcVar18 = "check position";
  }
  else {
    pcVar37 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_1328 = (code *)0x131982;
    _ok((uint)(iVar4 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar17);
    pcStack_1328 = (code *)0x1319aa;
    _ok((uint)(pcVar30 == pcStack_1318),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar40 = ABS(dStack_1308 - dStack_1300) < 1e-15;
    pcVar30 = "double_eq(num1, num2)";
    iVar4 = 0x73e;
    pcVar18 = "check float number";
  }
  pacVar10 = (char (*) [16])(ulong)bVar40;
  pcStack_1328 = (code *)0x131a40;
  _ok((uint)bVar40,pcVar30,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar4,
      pcVar18);
  lVar7 = lVar7 + 1;
  pcVar38 = pcVar38 + 0x10;
  uVar36 = uVar36 - 1;
  if (uVar36 == 0) {
    return;
  }
  goto LAB_001317a5;
LAB_00131bd0:
  lVar12 = lVar7 * 0x10;
  bVar2 = *(byte *)((long)puVar34 + -2);
  uVar36 = (ulong)bVar2;
  mVar3 = mp_type_hint[uVar36];
  puVar23 = puVar34;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      uVar36 = (ulong)*(byte *)((long)puVar34 + -1);
      break;
    case 0xcd:
      uVar36 = (ulong)(ushort)(*(ushort *)((long)puVar34 + -1) << 8 |
                              *(ushort *)((long)puVar34 + -1) >> 8);
      puVar23 = (undefined8 *)(auStack_1455 + lVar12);
      break;
    case 0xce:
      uVar20 = *(uint *)((long)puVar34 + -1);
      uVar36 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                      uVar20 << 0x18);
      puVar23 = (undefined8 *)(auStack_1455 + lVar12 + 2);
      break;
    case 0xcf:
      uVar36 = *(ulong *)((long)puVar34 + -1);
      uVar36 = uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
               (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
               (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 | (uVar36 & 0xff00) << 0x28
               | uVar36 << 0x38;
      puVar23 = &uStack_144f + lVar7 * 2;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_00131e46:
        pcStack_1580 = (code *)0x131e4b;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e4b:
        pcStack_1580 = (code *)0x131e50;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e50:
        pcStack_1580 = (code *)0x131e6f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar23 = (undefined8 *)(auStack_1457 + lVar12);
    }
    if (uVar36 != 0x642c88) {
      pcStack_1580 = (code *)0x131e98;
      test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e98:
      pcStack_1580 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_1790,"typed read of ",0xf);
      puStack_1590 = puVar23;
      pbStack_1588 = pbVar26;
      pcStack_1580 = (code *)lVar8;
      iVar4 = snprintf(acStack_1790 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar17 = acStack_1790 + (long)iVar4 + 0xe;
      iVar4 = snprintf(pcVar17,(size_t)(&uStack_1690 + -(long)pcVar17)," into ");
      snprintf(pcVar17 + iVar4,(size_t)(&uStack_1690 + -(long)(pcVar17 + iVar4)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_1790,_stdout);
      fputc(10,_stdout);
      uStack_1690 = 0xcb;
      uStack_168f = 0xb81e85eb513816c0;
      puStack_1798 = &uStack_1690;
      dStack_17a0 = 0.0;
      iVar4 = (*pcVar15)(&puStack_1798,&dStack_17a0);
      _ok((uint)(iVar4 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_1687 == puStack_1798),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_17a0) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_00131e74:
      pcStack_1580 = (code *)0x131e93;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar20 = *(uint *)((long)puVar34 + -1);
    fVar13 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                    uVar20 << 0x18);
    if ((fVar13 != 6.565e+06) || (NAN(fVar13))) goto LAB_00131e4b;
    puVar23 = (undefined8 *)((long)puVar34 + 3);
  }
  else if (mVar3 == MP_INT) {
    uVar36 = (ulong)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      uVar36 = (ulong)*(char *)((long)puVar34 + -1);
      break;
    case 0xd1:
      uVar36 = (ulong)(short)(*(ushort *)((long)puVar34 + -1) << 8 |
                             *(ushort *)((long)puVar34 + -1) >> 8);
      puVar23 = (undefined8 *)(auStack_1455 + lVar12);
      break;
    case 0xd2:
      uVar20 = *(uint *)((long)puVar34 + -1);
      uVar36 = (ulong)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                           uVar20 << 0x18);
      puVar23 = (undefined8 *)(auStack_1455 + lVar12 + 2);
      break;
    case 0xd3:
      uVar36 = *(ulong *)((long)puVar34 + -1);
      uVar36 = uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
               (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
               (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 | (uVar36 & 0xff00) << 0x28
               | uVar36 << 0x38;
      puVar23 = &uStack_144f + lVar7 * 2;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_1580 = (code *)0x131e46;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00131e46;
      }
      puVar23 = (undefined8 *)(auStack_1457 + lVar12);
    }
    if (uVar36 != 0x642c88) goto LAB_00131e98;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_00131e50;
    uVar36 = *(ulong *)((long)puVar34 + -1);
    dVar16 = (double)(uVar36 >> 0x38 | (uVar36 & 0xff000000000000) >> 0x28 |
                      (uVar36 & 0xff0000000000) >> 0x18 | (uVar36 & 0xff00000000) >> 8 |
                      (uVar36 & 0xff000000) << 8 | (uVar36 & 0xff0000) << 0x18 |
                      (uVar36 & 0xff00) << 0x28 | uVar36 << 0x38);
    if ((dVar16 != 6565000.0) || (NAN(dVar16))) {
      pcStack_1580 = (code *)0x131e74;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      goto LAB_00131e74;
    }
    puVar23 = &uStack_144f + lVar7 * 2;
  }
  puStack_1568 = (undefined8 *)((long)puVar34 + -2);
  pbVar26 = (byte *)(ulong)(uint)(int)(char)bVar2;
  dStack_1570 = 0.0;
  pcStack_1580 = (code *)0x131d8a;
  iVar4 = (*(code *)pacStack_1560)(&puStack_1568,&dStack_1570);
  pcStack_1580 = (code *)0x131db2;
  _ok((uint)(iVar4 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",pbVar26);
  pcStack_1580 = (code *)0x131dda;
  _ok((uint)(puVar23 == puStack_1568),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar40 = ABS(6565000.0 - dStack_1570) < 1e-15;
  pcVar15 = (code *)(ulong)bVar40;
  pcStack_1580 = (code *)0x131e1f;
  _ok((uint)bVar40,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar7 = lVar7 + 1;
  puVar34 = puVar34 + 2;
  lVar8 = lVar8 + -1;
  if (lVar8 != 0) {
    return;
  }
  goto LAB_00131bd0;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}